

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_crusader.cpp
# Opt level: O2

int AF_A_CrusaderSweepLeft(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  AActor *dest;
  PClassActor *type;
  AActor *pAVar4;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054b188;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar4 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar4 == (AActor *)0x0) {
LAB_0054b076:
        pAVar4 = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054b188;
        }
      }
      if (numparam == 1) goto LAB_0054b0f6;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0054b178;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054b188;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054b178;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054b0f6:
        dVar1 = (pAVar4->__Pos).Z;
        (pAVar4->Angles).Yaw.Degrees = (pAVar4->Angles).Yaw.Degrees + 5.625;
        dest = GC::ReadBarrier<AActor>((AActor **)&pAVar4->target);
        type = PClass::FindActor("FastFlameMissile");
        pAVar4 = P_SpawnMissileZAimed(pAVar4,dVar1 + 48.0,dest,type);
        if (pAVar4 != (AActor *)0x0) {
          (pAVar4->Vel).Z = (pAVar4->Vel).Z + 1.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054b188;
    }
    if (pAVar4 == (AActor *)0x0) goto LAB_0054b076;
  }
LAB_0054b178:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054b188:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                ,0x36,"int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CrusaderSweepLeft)
{
	PARAM_ACTION_PROLOGUE;

	self->Angles.Yaw += 90./16;
	AActor *misl = P_SpawnMissileZAimed (self, self->Z() + 48, self->target, PClass::FindActor("FastFlameMissile"));
	if (misl != NULL)
	{
		misl->Vel.Z += 1;
	}
	return 0;
}